

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlStreamPushInternal(xmlStreamCtxtPtr stream,xmlChar *name,xmlChar *ns,int nodeType)

{
  int iVar1;
  uint uVar2;
  xmlStreamCompPtr pxVar3;
  int *piVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  int iVar7;
  int iVar8;
  xmlStreamStepPtr pxVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  _xmlStreamCtxt *comp;
  byte bVar15;
  bool bVar16;
  uint local_6c;
  int local_44;
  
  if ((stream == (xmlStreamCtxtPtr)0x0) || (stream->nbState < 0)) {
    return -1;
  }
  uVar13 = 0;
  local_44 = 0;
  do {
    uVar11 = 0;
    comp = stream;
    local_6c = uVar13;
    while( true ) {
      uVar12 = 1;
      if (comp == (xmlStreamCtxtPtr)0x0) {
        if (local_44 < 1) {
          return local_6c;
        }
        return -1;
      }
      pxVar3 = comp->comp;
      if (ns == (xmlChar *)0x0 && (name == (xmlChar *)0x0 && nodeType == 1)) break;
      if (pxVar3->nbStep == 0) {
        if ((comp->flags & 1U) != 0) goto LAB_00168a99;
        if ((nodeType != 2) && (((comp->flags & 6U) == 0 || (comp->level == 0)))) {
          local_6c = uVar12;
        }
LAB_00168d3c:
        comp->level = comp->level + 1;
      }
      else {
        if ((comp->blockLevel != -1) ||
           ((nodeType - 3U < 0xfffffffe && ((pxVar3->flags & 0x4000) == 0)))) goto LAB_00168d3c;
        iVar8 = comp->nbState;
        for (iVar10 = 0; iVar10 < iVar8; iVar10 = iVar10 + 1) {
          piVar4 = comp->states;
          if (((uint)pxVar3->flags >> 0x10 & 1) == 0) {
            iVar7 = comp->level;
            if (piVar4[comp->nbState * 2 + -1] < iVar7) {
              return -1;
            }
            iVar14 = piVar4[comp->nbState * 2 + -2];
            pxVar9 = pxVar3->steps;
            iVar10 = iVar8;
LAB_00168b2a:
            uVar12 = pxVar9[iVar14].flags;
            iVar1 = pxVar9[iVar14].nodeType;
            if (iVar1 == nodeType) {
              if (nodeType == 100) {
LAB_00168c79:
                bVar15 = 0;
                uVar11 = uVar12 & 2;
                uVar2 = 1;
                if (uVar11 == 0) {
                  xmlStreamCtxtAddState(comp,iVar14 + 1,comp->level + 1);
                  if (local_6c == 1) {
                    local_6c = 1;
                  }
                  else {
                    local_6c = uVar12 >> 5 & 1;
                  }
                  uVar11 = 0;
                  bVar15 = 0;
                  uVar2 = local_6c;
                }
              }
              else {
                pxVar5 = pxVar9[iVar14].name;
                pxVar6 = pxVar9[iVar14].ns;
                if (pxVar5 == (xmlChar *)0x0) {
                  if (pxVar6 == (xmlChar *)0x0) goto LAB_00168c79;
                  if (ns != (xmlChar *)0x0) goto LAB_00168c5d;
                }
                else if ((((name != (xmlChar *)0x0) &&
                          ((ns == (xmlChar *)0x0) != (pxVar6 != (xmlChar *)0x0))) &&
                         (*pxVar5 == *name)) && (iVar7 = xmlStrEqual(pxVar5,name), iVar7 != 0)) {
                  if (pxVar6 != ns) {
LAB_00168c5d:
                    iVar7 = xmlStrEqual(pxVar6,ns);
                    if (iVar7 == 0) goto LAB_00168cf5;
                  }
                  goto LAB_00168c79;
                }
LAB_00168cf5:
                bVar15 = 1;
                uVar2 = local_6c;
              }
              local_6c = uVar2;
              if ((pxVar3->flags & 0x10000) == 0) {
                if ((bool)(bVar15 | uVar11 != 0)) {
                  iVar7 = comp->level;
                  goto LAB_00168d15;
                }
                uVar11 = 0;
              }
            }
            else {
              if (iVar1 == 100) goto LAB_00168c79;
              if ((iVar1 != 2) || (((uint)pxVar3->flags >> 0x10 & 1) != 0)) goto LAB_00168d20;
LAB_00168d15:
              comp->blockLevel = iVar7 + 1;
            }
          }
          else {
            iVar14 = piVar4[(uint)(iVar10 * 2)];
            if (-1 < (long)iVar14) {
              iVar7 = comp->level;
              if ((piVar4[(ulong)(uint)(iVar10 * 2) + 1] <= iVar7) &&
                 ((pxVar9 = pxVar3->steps, iVar7 <= piVar4[(ulong)(uint)(iVar10 * 2) + 1] ||
                  ((pxVar9[iVar14].flags & 1U) != 0)))) goto LAB_00168b2a;
            }
          }
LAB_00168d20:
        }
        iVar8 = comp->level;
        iVar10 = iVar8 + 1;
        comp->level = iVar10;
        pxVar9 = pxVar3->steps;
        uVar12 = pxVar9->flags;
        if ((uVar12 & 4) != 0) goto LAB_00168a99;
        pxVar5 = pxVar9->name;
        pxVar6 = pxVar9->ns;
        uVar2 = comp->flags;
        if ((uVar2 & 7) == 0) {
LAB_00168d9c:
          if (pxVar9->nodeType == nodeType) {
            if (nodeType == 100) {
LAB_00168e4d:
              uVar11 = uVar12 & 2;
              bVar15 = 0;
              uVar2 = 1;
              if (uVar11 == 0) {
                xmlStreamCtxtAddState(comp,1,comp->level);
                bVar16 = local_6c != 1;
                local_6c = 1;
                if (bVar16) {
                  local_6c = uVar12 >> 5 & 1;
                }
                uVar11 = 0;
                bVar15 = 0;
                uVar2 = local_6c;
              }
            }
            else {
              uVar2 = local_6c;
              if (pxVar5 == (xmlChar *)0x0) {
                if (pxVar6 != (xmlChar *)0x0) {
                  if (ns == (xmlChar *)0x0) goto LAB_00168f1a;
                  iVar8 = xmlStrEqual(pxVar6,ns);
                  uVar11 = uVar12 & 2;
                  if (iVar8 == 0) {
                    bVar15 = 1;
                    goto LAB_00168f22;
                  }
                }
                goto LAB_00168e4d;
              }
              if ((((name != (xmlChar *)0x0) &&
                   ((ns == (xmlChar *)0x0) != (pxVar6 != (xmlChar *)0x0))) && (*pxVar5 == *name)) &&
                 ((iVar8 = xmlStrEqual(pxVar5,name), iVar8 != 0 &&
                  ((pxVar6 == ns || (iVar8 = xmlStrEqual(pxVar6,ns), iVar8 != 0))))))
              goto LAB_00168e4d;
LAB_00168f1a:
              uVar11 = uVar12 & 2;
              bVar15 = 1;
            }
LAB_00168f22:
            local_6c = uVar2;
            if ((pxVar3->flags & 0x10000) == 0) {
              if ((bool)(~bVar15 & uVar11 == 0)) {
                uVar11 = 0;
              }
              else {
                comp->blockLevel = comp->level;
              }
            }
          }
          else if ((nodeType != 2) && (pxVar9->nodeType == 100)) goto LAB_00168e4d;
        }
        else if (iVar8 == 0) {
          if ((uVar2 & 6) == 0) goto LAB_00168d9c;
        }
        else if (((uVar12 & 1) != 0) || ((uVar2 & 6) != 0 && iVar10 == 2)) goto LAB_00168d9c;
      }
LAB_00168a99:
      comp = comp->next;
    }
    stream->nbState = 0;
    stream->level = 0;
    stream->blockLevel = -1;
    uVar11 = uVar13;
    if (((pxVar3->flags & 0x8000) != 0) && (uVar11 = uVar12, pxVar3->nbStep != 0)) {
      if (pxVar3->nbStep == 1) {
        pxVar9 = pxVar3->steps;
        if ((pxVar9->nodeType == 100) && ((pxVar9->flags & 1) != 0)) goto LAB_00168fdb;
      }
      else {
        pxVar9 = pxVar3->steps;
      }
      uVar11 = uVar13;
      if ((pxVar9->flags & 4) != 0) {
        iVar8 = xmlStreamCtxtAddState(stream,0,0);
        local_44 = local_44 - (iVar8 >> 0x1f);
      }
    }
LAB_00168fdb:
    uVar13 = uVar11;
    stream = stream->next;
  } while( true );
}

Assistant:

static int
xmlStreamPushInternal(xmlStreamCtxtPtr stream,
		      const xmlChar *name, const xmlChar *ns,
		      int nodeType) {
    int ret = 0, err = 0, final = 0, tmp, i, m, match, stepNr, desc;
    xmlStreamCompPtr comp;
    xmlStreamStep step;
#ifdef DEBUG_STREAMING
    xmlStreamCtxtPtr orig = stream;
#endif

    if ((stream == NULL) || (stream->nbState < 0))
        return(-1);

    while (stream != NULL) {
	comp = stream->comp;

	if ((nodeType == XML_ELEMENT_NODE) &&
	    (name == NULL) && (ns == NULL)) {
	    /* We have a document node here (or a reset). */
	    stream->nbState = 0;
	    stream->level = 0;
	    stream->blockLevel = -1;
	    if (comp->flags & XML_STREAM_FROM_ROOT) {
		if (comp->nbStep == 0) {
		    /* TODO: We have a "/." here? */
		    ret = 1;
		} else {
		    if ((comp->nbStep == 1) &&
			(comp->steps[0].nodeType == XML_STREAM_ANY_NODE) &&
			(comp->steps[0].flags & XML_STREAM_STEP_DESC))
		    {
			/*
			* In the case of "//." the document node will match
			* as well.
			*/
			ret = 1;
		    } else if (comp->steps[0].flags & XML_STREAM_STEP_ROOT) {
			/* TODO: Do we need this ? */
			tmp = xmlStreamCtxtAddState(stream, 0, 0);
			if (tmp < 0)
			    err++;
		    }
		}
	    }
	    stream = stream->next;
	    continue; /* while */
	}

	/*
	* Fast check for ".".
	*/
	if (comp->nbStep == 0) {
	    /*
	     * / and . are handled at the XPath node set creation
	     * level by checking min depth
	     */
	    if (stream->flags & XML_PATTERN_XPATH) {
		stream = stream->next;
		continue; /* while */
	    }
	    /*
	    * For non-pattern like evaluation like XML Schema IDCs
	    * or traditional XPath expressions, this will match if
	    * we are at the first level only, otherwise on every level.
	    */
	    if ((nodeType != XML_ATTRIBUTE_NODE) &&
		(((stream->flags & XML_PATTERN_NOTPATTERN) == 0) ||
		(stream->level == 0))) {
		    ret = 1;
	    }
	    stream->level++;
	    goto stream_next;
	}
	if (stream->blockLevel != -1) {
	    /*
	    * Skip blocked expressions.
	    */
	    stream->level++;
	    goto stream_next;
	}

	if ((nodeType != XML_ELEMENT_NODE) &&
	    (nodeType != XML_ATTRIBUTE_NODE) &&
	    ((comp->flags & XML_STREAM_FINAL_IS_ANY_NODE) == 0)) {
	    /*
	    * No need to process nodes of other types if we don't
	    * resolve to those types.
	    * TODO: Do we need to block the context here?
	    */
	    stream->level++;
	    goto stream_next;
	}

	/*
	 * Check evolution of existing states
	 */
	i = 0;
	m = stream->nbState;
	while (i < m) {
	    if ((comp->flags & XML_STREAM_DESC) == 0) {
		/*
		* If there is no "//", then only the last
		* added state is of interest.
		*/
		stepNr = stream->states[2 * (stream->nbState -1)];
		/*
		* TODO: Security check, should not happen, remove it.
		*/
		if (stream->states[(2 * (stream->nbState -1)) + 1] <
		    stream->level) {
		    return (-1);
		}
		desc = 0;
		/* loop-stopper */
		i = m;
	    } else {
		/*
		* If there are "//", then we need to process every "//"
		* occurring in the states, plus any other state for this
		* level.
		*/
		stepNr = stream->states[2 * i];

		/* TODO: should not happen anymore: dead states */
		if (stepNr < 0)
		    goto next_state;

		tmp = stream->states[(2 * i) + 1];

		/* skip new states just added */
		if (tmp > stream->level)
		    goto next_state;

		/* skip states at ancestor levels, except if "//" */
		desc = comp->steps[stepNr].flags & XML_STREAM_STEP_DESC;
		if ((tmp < stream->level) && (!desc))
		    goto next_state;
	    }
	    /*
	    * Check for correct node-type.
	    */
	    step = comp->steps[stepNr];
	    if (step.nodeType != nodeType) {
		if (step.nodeType == XML_ATTRIBUTE_NODE) {
		    /*
		    * Block this expression for deeper evaluation.
		    */
		    if ((comp->flags & XML_STREAM_DESC) == 0)
			stream->blockLevel = stream->level +1;
		    goto next_state;
		} else if (step.nodeType != XML_STREAM_ANY_NODE)
		    goto next_state;
	    }
	    /*
	    * Compare local/namespace-name.
	    */
	    match = 0;
	    if (step.nodeType == XML_STREAM_ANY_NODE) {
		match = 1;
	    } else if (step.name == NULL) {
		if (step.ns == NULL) {
		    /*
		    * This lets through all elements/attributes.
		    */
		    match = 1;
		} else if (ns != NULL)
		    match = xmlStrEqual(step.ns, ns);
	    } else if (((step.ns != NULL) == (ns != NULL)) &&
		(name != NULL) &&
		(step.name[0] == name[0]) &&
		xmlStrEqual(step.name, name) &&
		((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	    {
		match = 1;
	    }
#if 0
/*
* TODO: Pointer comparison won't work, since not guaranteed that the given
*  values are in the same dict; especially if it's the namespace name,
*  normally coming from ns->href. We need a namespace dict mechanism !
*/
	    } else if (comp->dict) {
		if (step.name == NULL) {
		    if (step.ns == NULL)
			match = 1;
		    else
			match = (step.ns == ns);
		} else {
		    match = ((step.name == name) && (step.ns == ns));
		}
#endif /* if 0 ------------------------------------------------------- */
	    if (match) {
		final = step.flags & XML_STREAM_STEP_FINAL;
		if (desc) {
		    if (final) {
			ret = 1;
		    } else {
			/* descending match create a new state */
			xmlStreamCtxtAddState(stream, stepNr + 1,
			                      stream->level + 1);
		    }
		} else {
		    if (final) {
			ret = 1;
		    } else {
			xmlStreamCtxtAddState(stream, stepNr + 1,
			                      stream->level + 1);
		    }
		}
		if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		    /*
		    * Check if we have a special case like "foo/bar//.", where
		    * "foo" is selected as well.
		    */
		    ret = 1;
		}
	    }
	    if (((comp->flags & XML_STREAM_DESC) == 0) &&
		((! match) || final))  {
		/*
		* Mark this expression as blocked for any evaluation at
		* deeper levels. Note that this includes "/foo"
		* expressions if the *pattern* behaviour is used.
		*/
		stream->blockLevel = stream->level +1;
	    }
next_state:
	    i++;
	}

	stream->level++;

	/*
	* Re/enter the expression.
	* Don't reenter if it's an absolute expression like "/foo",
	*   except "//foo".
	*/
	step = comp->steps[0];
	if (step.flags & XML_STREAM_STEP_ROOT)
	    goto stream_next;

	desc = step.flags & XML_STREAM_STEP_DESC;
	if (stream->flags & XML_PATTERN_NOTPATTERN) {
	    /*
	    * Re/enter the expression if it is a "descendant" one,
	    * or if we are at the 1st level of evaluation.
	    */

	    if (stream->level == 1) {
		if (XML_STREAM_XS_IDC(stream)) {
		    /*
		    * XS-IDC: The missing "self::node()" will always
		    * match the first given node.
		    */
		    goto stream_next;
		} else
		    goto compare;
	    }
	    /*
	    * A "//" is always reentrant.
	    */
	    if (desc)
		goto compare;

	    /*
	    * XS-IDC: Process the 2nd level, since the missing
	    * "self::node()" is responsible for the 2nd level being
	    * the real start level.
	    */
	    if ((stream->level == 2) && XML_STREAM_XS_IDC(stream))
		goto compare;

	    goto stream_next;
	}

compare:
	/*
	* Check expected node-type.
	*/
	if (step.nodeType != nodeType) {
	    if (nodeType == XML_ATTRIBUTE_NODE)
		goto stream_next;
	    else if (step.nodeType != XML_STREAM_ANY_NODE)
		goto stream_next;
	}
	/*
	* Compare local/namespace-name.
	*/
	match = 0;
	if (step.nodeType == XML_STREAM_ANY_NODE) {
	    match = 1;
	} else if (step.name == NULL) {
	    if (step.ns == NULL) {
		/*
		* This lets through all elements/attributes.
		*/
		match = 1;
	    } else if (ns != NULL)
		match = xmlStrEqual(step.ns, ns);
	} else if (((step.ns != NULL) == (ns != NULL)) &&
	    (name != NULL) &&
	    (step.name[0] == name[0]) &&
	    xmlStrEqual(step.name, name) &&
	    ((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	{
	    match = 1;
	}
	final = step.flags & XML_STREAM_STEP_FINAL;
	if (match) {
	    if (final)
		ret = 1;
	    else
		xmlStreamCtxtAddState(stream, 1, stream->level);
	    if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		/*
		* Check if we have a special case like "foo//.", where
		* "foo" is selected as well.
		*/
		ret = 1;
	    }
	}
	if (((comp->flags & XML_STREAM_DESC) == 0) &&
	    ((! match) || final))  {
	    /*
	    * Mark this expression as blocked for any evaluation at
	    * deeper levels.
	    */
	    stream->blockLevel = stream->level;
	}

stream_next:
        stream = stream->next;
    } /* while stream != NULL */

    if (err > 0)
        ret = -1;
#ifdef DEBUG_STREAMING
    xmlDebugStreamCtxt(orig, ret);
#endif
    return(ret);
}